

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

int check_physical(CPUPPCState_conflict2 *env,mmu_ctx_t_conflict *ctx,target_ulong eaddr,int rw)

{
  powerpc_mmu_t pVar1;
  bool bVar2;
  
  ctx->raddr = eaddr;
  ctx->prot = 5;
  pVar1 = env->mmu_model;
  if (pVar1 < POWERPC_MMU_BOOKE206) {
    if ((0x15cU >> (pVar1 & 0x1f) & 1) == 0) {
      if (pVar1 != POWERPC_MMU_SOFT_4xx_Z) goto LAB_009e3b7b;
      if ((env->msr & 8) != 0) {
        if (((eaddr < env->pb[1]) && (env->pb[0] <= eaddr)) && (env->pb[0] < env->pb[1])) {
          bVar2 = true;
        }
        else if (eaddr < env->pb[2] || env->pb[3] <= env->pb[2]) {
          bVar2 = false;
        }
        else {
          bVar2 = eaddr < env->pb[3];
        }
        if (bVar2 == (((uint)env->msr >> 2 & 1) != 0)) {
          ctx->prot = 7;
          return 0;
        }
        return (uint)(rw != 1) * 2 + -2;
      }
    }
    else {
      ctx->prot = 7;
    }
    return 0;
  }
LAB_009e3b7b:
  abort();
}

Assistant:

static inline int check_physical(CPUPPCState *env, mmu_ctx_t *ctx,
                                 target_ulong eaddr, int rw)
{
    int in_plb, ret;

    ctx->raddr = eaddr;
    ctx->prot = PAGE_READ | PAGE_EXEC;
    ret = 0;
    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_REAL:
    case POWERPC_MMU_BOOKE:
        ctx->prot |= PAGE_WRITE;
        break;

    case POWERPC_MMU_SOFT_4xx_Z:
        if (unlikely(msr_pe != 0)) {
            /*
             * 403 family add some particular protections, using
             * PBL/PBU registers for accesses with no translation.
             */
            in_plb =
                /* Check PLB validity */
                (env->pb[0] < env->pb[1] &&
                 /* and address in plb area */
                 eaddr >= env->pb[0] && eaddr < env->pb[1]) ||
                (env->pb[2] < env->pb[3] &&
                 eaddr >= env->pb[2] && eaddr < env->pb[3]) ? 1 : 0;
            if (in_plb ^ msr_px) {
                /* Access in protected area */
                if (rw == 1) {
                    /* Access is not allowed */
                    ret = -2;
                }
            } else {
                /* Read-write access is allowed */
                ctx->prot |= PAGE_WRITE;
            }
        }
        break;

    default:
        /* Caller's checks mean we should never get here for other models */
        abort();
        return -1;
    }

    return ret;
}